

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O3

pair<unsigned_long,_bool>
detail::try_get_range_size<std::vector<person,std::allocator<person>>>(span<const_std::byte> buffer)

{
  ulong uVar1;
  undefined8 in_RDX;
  byte *pbVar2;
  unsigned_long uVar3;
  long lVar4;
  byte *pbVar5;
  undefined8 uVar6;
  span<const_std::byte> buffer_00;
  pair<unsigned_long,_bool> pVar7;
  
  pbVar5 = buffer.begin_;
  uVar1 = (long)buffer.end_ - (long)pbVar5;
  if (-1 < (long)uVar1) {
    if (uVar1 < 8) {
LAB_0010539c:
      uVar3 = 0;
      uVar6 = 0;
    }
    else {
      pbVar2 = pbVar5 + 8;
      for (uVar6 = *(undefined8 *)pbVar5; uVar6 != 0; uVar6 = uVar6 - 1) {
        lVar4 = (long)buffer.end_ - (long)pbVar2;
        if (lVar4 < 0) goto LAB_001053e8;
        buffer_00.end_ = pbVar2 + lVar4;
        buffer_00.begin_ = pbVar2;
        pVar7 = try_get_deserialized_size<person>(buffer_00);
        in_RDX = pVar7._8_8_;
        if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0010539c;
        pbVar2 = pbVar2 + pVar7.first;
      }
      uVar3 = (long)pbVar2 - (long)pbVar5;
      uVar6 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
    }
    pVar7._8_8_ = uVar6;
    pVar7.first = uVar3;
    return pVar7;
  }
LAB_001053e8:
  __assert_fail("diff >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Dwarfobserver[P]binary_serialization/src/include/span.hpp"
                ,0x22,"size_t span<const std::byte>::size() const [T = const std::byte]");
}

Assistant:

constexpr serialization_category get_serialization_category() {
        if constexpr (std::is_pointer_v<T> || std::is_array_v<T>) {
            return serialization_category::forbidden;
        }
        else if constexpr (std::is_trivially_copyable_v<T>) {
            return serialization_category::trivial;
        }
        else if constexpr (is_array_v<T>) {
            if constexpr (std::is_trivially_copyable_v<typename array_traits<T>::value_type>) {
                static_assert(is_dynamic_array_v<T>);
                return serialization_category::trivial_array;
            }
            else if constexpr (is_dynamic_array_v<T>) {
                return serialization_category::dynamic_array;
            }
            else {
                static_assert(has_fixed_size_v<T>);
                return serialization_category::fixed_array;
            }
        }
        else if constexpr (is_container_v<T>) {
            return serialization_category::container;
        }
        else if constexpr (detail::no_adl::has_std_get<T>() && detail::no_adl::has_fixed_size<T>()) {
            return serialization_category::tuple;
        }
        else if constexpr (is_aggregate_v<T>) {
            return serialization_category::aggregate;
        }
        else {
            return serialization_category::unknown;
        }
    }